

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

boolean decode_mcu_fast(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  long lVar2;
  long lVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  sbyte sVar10;
  long in_RSI;
  long in_RDI;
  bool bVar11;
  int c0_23;
  int c1_22;
  int c0_22;
  int c1_21;
  int c0_21;
  int c1_20;
  int c0_20;
  int c1_19;
  int c0_19;
  int c1_18;
  int c0_18;
  int c1_17;
  int c0_17;
  int c1_16;
  int c0_16;
  int c1_15;
  int c0_15;
  int c1_14;
  int c0_14;
  int c1_13;
  int c0_13;
  int c1_12;
  int c0_12;
  int ci;
  int c1_11;
  int c0_11;
  int c1_10;
  int c0_10;
  int c1_9;
  int c0_9;
  int c1_8;
  int c0_8;
  int c1_7;
  int c0_7;
  int c1_6;
  int c0_6;
  int c1_5;
  int c0_5;
  int c1_4;
  int c0_4;
  int c1_3;
  int c0_3;
  int c1_2;
  int c0_2;
  int c1_1;
  int c0_1;
  int c1;
  int c0;
  int l;
  int r;
  int k;
  int s;
  d_derived_tbl *actbl;
  d_derived_tbl *dctbl;
  JBLOCKROW block;
  savable_state_conflict state;
  int blkn;
  JOCTET *buffer;
  bitread_working_state br_state;
  int bits_left;
  bit_buf_type get_buffer;
  huff_entropy_ptr_conflict entropy;
  undefined2 *local_1d0;
  int local_a0;
  int local_98;
  uint local_94;
  undefined8 local_74;
  undefined8 local_6c;
  int c1_35;
  int c0_35;
  int c1_34;
  int c0_34;
  int c1_33;
  int c0_33;
  int c1_32;
  int c0_32;
  int c1_31;
  int c0_31;
  int c1_30;
  int c0_30;
  int c1_29;
  int c0_29;
  int c1_28;
  int c0_28;
  int c1_27;
  int c0_27;
  int c1_26;
  int c0_26;
  int c1_25;
  int c0_25;
  int c1_24;
  int c0_24;
  int c1_23;
  
  _c0_27 = *(long *)(in_RDI + 0x250);
  _c0_34 = (byte *)**(undefined8 **)(in_RDI + 0x28);
  _c0_33 = *(long *)(*(long *)(in_RDI + 0x28) + 8);
  _c0_28 = *(ulong *)(_c0_27 + 0x18);
  c1_28 = *(int *)(_c0_27 + 0x20);
  _c0_35 = (byte *)**(undefined8 **)(in_RDI + 0x28);
  local_74 = *(undefined8 *)(_c0_27 + 0x28);
  local_6c = *(undefined8 *)(_c0_27 + 0x30);
  c1_35 = 0;
  _c0_26 = in_RSI;
  _c0_25 = in_RDI;
  do {
    if (*(int *)(_c0_25 + 0x1e0) <= c1_35) {
      bVar11 = *(int *)(_c0_25 + 0x21c) == 0;
      if (bVar11) {
        **(undefined8 **)(_c0_25 + 0x28) = _c0_35;
        *(long *)(*(long *)(_c0_25 + 0x28) + 8) = _c0_33 - ((long)_c0_35 - (long)_c0_34);
        *(ulong *)(_c0_27 + 0x18) = _c0_28;
        *(int *)(_c0_27 + 0x20) = c1_28;
        *(undefined8 *)(_c0_27 + 0x28) = local_74;
        *(undefined8 *)(_c0_27 + 0x30) = local_6c;
      }
      else {
        *(undefined4 *)(_c0_25 + 0x21c) = 0;
      }
      c1_23 = (int)bVar11;
      return c1_23;
    }
    if (_c0_26 == 0) {
      local_1d0 = (undefined2 *)0x0;
    }
    else {
      local_1d0 = *(undefined2 **)(_c0_26 + (long)c1_35 * 8);
    }
    lVar2 = *(long *)(_c0_27 + 0x80 + (long)c1_35 * 8);
    lVar3 = *(long *)(_c0_27 + 0xd0 + (long)c1_35 * 8);
    if (c1_28 < 0x11) {
      uVar6 = (uint)_c0_35[1];
      uVar8 = _c0_28 << 8;
      _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
      pbVar4 = _c0_35 + 1;
      if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
        *(uint *)(_c0_25 + 0x21c) = uVar6;
        pbVar4 = _c0_35;
        _c0_28 = uVar8;
      }
      _c0_35 = pbVar4;
      uVar6 = (uint)_c0_35[1];
      uVar8 = _c0_28 << 8;
      _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
      pbVar4 = _c0_35 + 1;
      if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
        *(uint *)(_c0_25 + 0x21c) = uVar6;
        pbVar4 = _c0_35;
        _c0_28 = uVar8;
      }
      _c0_35 = pbVar4;
      uVar6 = (uint)_c0_35[1];
      uVar8 = _c0_28 << 8;
      _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
      pbVar4 = _c0_35 + 1;
      if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
        *(uint *)(_c0_25 + 0x21c) = uVar6;
        pbVar4 = _c0_35;
        _c0_28 = uVar8;
      }
      _c0_35 = pbVar4;
      uVar6 = (uint)_c0_35[1];
      uVar8 = _c0_28 << 8;
      _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
      pbVar4 = _c0_35 + 1;
      if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
        *(uint *)(_c0_25 + 0x21c) = uVar6;
        pbVar4 = _c0_35;
        _c0_28 = uVar8;
      }
      _c0_35 = pbVar4;
      uVar6 = (uint)_c0_35[1];
      uVar8 = _c0_28 << 8;
      _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
      pbVar4 = _c0_35 + 1;
      if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
        *(uint *)(_c0_25 + 0x21c) = uVar6;
        pbVar4 = _c0_35;
        _c0_28 = uVar8;
      }
      _c0_35 = pbVar4;
      pbVar4 = _c0_35;
      _c0_35 = _c0_35 + 1;
      uVar6 = (uint)*_c0_35;
      uVar8 = _c0_28 << 8;
      _c0_28 = uVar8 | (long)(int)(uint)*pbVar4;
      c1_28 = c1_28 + 0x30;
      if ((*pbVar4 == 0xff) && (_c0_35 = pbVar4 + 2, uVar6 != 0)) {
        *(uint *)(_c0_25 + 0x21c) = uVar6;
        _c0_35 = pbVar4;
        _c0_28 = uVar8;
      }
    }
    uVar6 = *(uint *)(lVar2 + 0x128 +
                     (long)(int)((uint)(_c0_28 >> ((char)c1_28 - 8U & 0x3f)) & 0xff) * 4);
    local_a0 = (int)uVar6 >> 8;
    c1_28 = c1_28 - local_a0;
    local_94 = uVar6 & 0xff;
    if (8 < local_a0) {
      for (local_94 = (uint)(_c0_28 >> ((byte)c1_28 & 0x3f)) &
                      (1 << ((byte)(uVar6 >> 8) & 0x1f)) - 1U;
          *(long *)(lVar2 + (long)local_a0 * 8) < (long)(int)local_94;
          local_94 = (uint)(_c0_28 >> ((byte)c1_28 & 0x3f)) & 1 | local_94 << 1) {
        c1_28 = c1_28 + -1;
        local_a0 = local_a0 + 1;
      }
      if (local_a0 < 0x11) {
        local_94 = (uint)*(byte *)(*(long *)(lVar2 + 0x120) + 0x11 +
                                  (long)(int)(local_94 +
                                              (int)*(undefined8 *)
                                                    (lVar2 + 0x90 + (long)local_a0 * 8) & 0xff));
      }
      else {
        local_94 = 0;
      }
    }
    if (local_94 != 0) {
      if (c1_28 < 0x11) {
        uVar6 = (uint)_c0_35[1];
        uVar8 = _c0_28 << 8;
        _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
        pbVar4 = _c0_35 + 1;
        if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
          *(uint *)(_c0_25 + 0x21c) = uVar6;
          pbVar4 = _c0_35;
          _c0_28 = uVar8;
        }
        _c0_35 = pbVar4;
        uVar6 = (uint)_c0_35[1];
        uVar8 = _c0_28 << 8;
        _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
        pbVar4 = _c0_35 + 1;
        if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
          *(uint *)(_c0_25 + 0x21c) = uVar6;
          pbVar4 = _c0_35;
          _c0_28 = uVar8;
        }
        _c0_35 = pbVar4;
        uVar6 = (uint)_c0_35[1];
        uVar8 = _c0_28 << 8;
        _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
        pbVar4 = _c0_35 + 1;
        if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
          *(uint *)(_c0_25 + 0x21c) = uVar6;
          pbVar4 = _c0_35;
          _c0_28 = uVar8;
        }
        _c0_35 = pbVar4;
        uVar6 = (uint)_c0_35[1];
        uVar8 = _c0_28 << 8;
        _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
        pbVar4 = _c0_35 + 1;
        if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
          *(uint *)(_c0_25 + 0x21c) = uVar6;
          pbVar4 = _c0_35;
          _c0_28 = uVar8;
        }
        _c0_35 = pbVar4;
        uVar6 = (uint)_c0_35[1];
        uVar8 = _c0_28 << 8;
        _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
        pbVar4 = _c0_35 + 1;
        if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
          *(uint *)(_c0_25 + 0x21c) = uVar6;
          pbVar4 = _c0_35;
          _c0_28 = uVar8;
        }
        _c0_35 = pbVar4;
        pbVar4 = _c0_35;
        _c0_35 = _c0_35 + 1;
        uVar6 = (uint)*_c0_35;
        uVar8 = _c0_28 << 8;
        _c0_28 = uVar8 | (long)(int)(uint)*pbVar4;
        c1_28 = c1_28 + 0x30;
        if ((*pbVar4 == 0xff) && (_c0_35 = pbVar4 + 2, uVar6 != 0)) {
          *(uint *)(_c0_25 + 0x21c) = uVar6;
          _c0_35 = pbVar4;
          _c0_28 = uVar8;
        }
      }
      c1_28 = c1_28 - local_94;
      bVar9 = (byte)local_94;
      local_94 = (uint)(_c0_28 >> ((byte)c1_28 & 0x3f)) & (1 << (bVar9 & 0x1f)) - 1U;
      local_94 = local_94 +
                 ((int)(local_94 - (1 << (bVar9 - 1 & 0x1f))) >> 0x1f & (-1 << (bVar9 & 0x1f)) + 1U)
      ;
    }
    if (*(int *)(_c0_27 + 0x120 + (long)c1_35 * 4) != 0) {
      iVar1 = *(int *)(_c0_25 + 0x1e4 + (long)c1_35 * 4);
      iVar5 = *(int *)((long)&local_74 + (long)iVar1 * 4) + local_94;
      *(int *)((long)&local_74 + (long)iVar1 * 4) = iVar5;
      if (local_1d0 != (undefined2 *)0x0) {
        *local_1d0 = (short)iVar5;
      }
    }
    if ((*(int *)(_c0_27 + 0x148 + (long)c1_35 * 4) == 0) || (local_1d0 == (undefined2 *)0x0)) {
      for (local_98 = 1; local_98 < 0x40; local_98 = local_98 + 1) {
        if (c1_28 < 0x11) {
          uVar6 = (uint)_c0_35[1];
          uVar8 = _c0_28 << 8;
          _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
          pbVar4 = _c0_35 + 1;
          if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
            *(uint *)(_c0_25 + 0x21c) = uVar6;
            pbVar4 = _c0_35;
            _c0_28 = uVar8;
          }
          _c0_35 = pbVar4;
          uVar6 = (uint)_c0_35[1];
          uVar8 = _c0_28 << 8;
          _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
          pbVar4 = _c0_35 + 1;
          if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
            *(uint *)(_c0_25 + 0x21c) = uVar6;
            pbVar4 = _c0_35;
            _c0_28 = uVar8;
          }
          _c0_35 = pbVar4;
          uVar6 = (uint)_c0_35[1];
          uVar8 = _c0_28 << 8;
          _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
          pbVar4 = _c0_35 + 1;
          if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
            *(uint *)(_c0_25 + 0x21c) = uVar6;
            pbVar4 = _c0_35;
            _c0_28 = uVar8;
          }
          _c0_35 = pbVar4;
          uVar6 = (uint)_c0_35[1];
          uVar8 = _c0_28 << 8;
          _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
          pbVar4 = _c0_35 + 1;
          if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
            *(uint *)(_c0_25 + 0x21c) = uVar6;
            pbVar4 = _c0_35;
            _c0_28 = uVar8;
          }
          _c0_35 = pbVar4;
          uVar6 = (uint)_c0_35[1];
          uVar8 = _c0_28 << 8;
          _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
          pbVar4 = _c0_35 + 1;
          if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
            *(uint *)(_c0_25 + 0x21c) = uVar6;
            pbVar4 = _c0_35;
            _c0_28 = uVar8;
          }
          _c0_35 = pbVar4;
          pbVar4 = _c0_35;
          _c0_35 = _c0_35 + 1;
          uVar6 = (uint)*_c0_35;
          uVar8 = _c0_28 << 8;
          _c0_28 = uVar8 | (long)(int)(uint)*pbVar4;
          c1_28 = c1_28 + 0x30;
          if ((*pbVar4 == 0xff) && (_c0_35 = pbVar4 + 2, uVar6 != 0)) {
            *(uint *)(_c0_25 + 0x21c) = uVar6;
            _c0_35 = pbVar4;
            _c0_28 = uVar8;
          }
        }
        uVar6 = *(uint *)(lVar3 + 0x128 +
                         (long)(int)((uint)(_c0_28 >> ((char)c1_28 - 8U & 0x3f)) & 0xff) * 4);
        local_a0 = (int)uVar6 >> 8;
        c1_28 = c1_28 - local_a0;
        local_94 = uVar6 & 0xff;
        if (8 < local_a0) {
          for (local_94 = (uint)(_c0_28 >> ((byte)c1_28 & 0x3f)) &
                          (1 << ((byte)(uVar6 >> 8) & 0x1f)) - 1U;
              *(long *)(lVar3 + (long)local_a0 * 8) < (long)(int)local_94;
              local_94 = (uint)(_c0_28 >> ((byte)c1_28 & 0x3f)) & 1 | local_94 << 1) {
            c1_28 = c1_28 + -1;
            local_a0 = local_a0 + 1;
          }
          if (local_a0 < 0x11) {
            local_94 = (uint)*(byte *)(*(long *)(lVar3 + 0x120) + 0x11 +
                                      (long)(int)(local_94 +
                                                  (int)*(undefined8 *)
                                                        (lVar3 + 0x90 + (long)local_a0 * 8) & 0xff))
            ;
          }
          else {
            local_94 = 0;
          }
        }
        if ((local_94 & 0xf) == 0) {
          if ((int)local_94 >> 4 != 0xf) break;
          local_98 = local_98 + 0xf;
        }
        else {
          local_98 = ((int)local_94 >> 4) + local_98;
          if (c1_28 < 0x11) {
            uVar6 = (uint)_c0_35[1];
            uVar8 = _c0_28 << 8;
            _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
            pbVar4 = _c0_35 + 1;
            if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
              *(uint *)(_c0_25 + 0x21c) = uVar6;
              pbVar4 = _c0_35;
              _c0_28 = uVar8;
            }
            _c0_35 = pbVar4;
            uVar6 = (uint)_c0_35[1];
            uVar8 = _c0_28 << 8;
            _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
            pbVar4 = _c0_35 + 1;
            if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
              *(uint *)(_c0_25 + 0x21c) = uVar6;
              pbVar4 = _c0_35;
              _c0_28 = uVar8;
            }
            _c0_35 = pbVar4;
            uVar6 = (uint)_c0_35[1];
            uVar8 = _c0_28 << 8;
            _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
            pbVar4 = _c0_35 + 1;
            if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
              *(uint *)(_c0_25 + 0x21c) = uVar6;
              pbVar4 = _c0_35;
              _c0_28 = uVar8;
            }
            _c0_35 = pbVar4;
            uVar6 = (uint)_c0_35[1];
            uVar8 = _c0_28 << 8;
            _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
            pbVar4 = _c0_35 + 1;
            if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
              *(uint *)(_c0_25 + 0x21c) = uVar6;
              pbVar4 = _c0_35;
              _c0_28 = uVar8;
            }
            _c0_35 = pbVar4;
            uVar6 = (uint)_c0_35[1];
            uVar8 = _c0_28 << 8;
            _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
            pbVar4 = _c0_35 + 1;
            if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
              *(uint *)(_c0_25 + 0x21c) = uVar6;
              pbVar4 = _c0_35;
              _c0_28 = uVar8;
            }
            _c0_35 = pbVar4;
            pbVar4 = _c0_35;
            _c0_35 = _c0_35 + 1;
            uVar6 = (uint)*_c0_35;
            uVar8 = _c0_28 << 8;
            _c0_28 = uVar8 | (long)(int)(uint)*pbVar4;
            c1_28 = c1_28 + 0x30;
            if ((*pbVar4 == 0xff) && (_c0_35 = pbVar4 + 2, uVar6 != 0)) {
              *(uint *)(_c0_25 + 0x21c) = uVar6;
              _c0_35 = pbVar4;
              _c0_28 = uVar8;
            }
          }
          c1_28 = c1_28 - (local_94 & 0xf);
        }
      }
    }
    else {
      for (local_98 = 1; local_98 < 0x40; local_98 = local_98 + 1) {
        if (c1_28 < 0x11) {
          uVar6 = (uint)_c0_35[1];
          uVar8 = _c0_28 << 8;
          _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
          pbVar4 = _c0_35 + 1;
          if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
            *(uint *)(_c0_25 + 0x21c) = uVar6;
            pbVar4 = _c0_35;
            _c0_28 = uVar8;
          }
          _c0_35 = pbVar4;
          uVar6 = (uint)_c0_35[1];
          uVar8 = _c0_28 << 8;
          _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
          pbVar4 = _c0_35 + 1;
          if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
            *(uint *)(_c0_25 + 0x21c) = uVar6;
            pbVar4 = _c0_35;
            _c0_28 = uVar8;
          }
          _c0_35 = pbVar4;
          uVar6 = (uint)_c0_35[1];
          uVar8 = _c0_28 << 8;
          _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
          pbVar4 = _c0_35 + 1;
          if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
            *(uint *)(_c0_25 + 0x21c) = uVar6;
            pbVar4 = _c0_35;
            _c0_28 = uVar8;
          }
          _c0_35 = pbVar4;
          uVar6 = (uint)_c0_35[1];
          uVar8 = _c0_28 << 8;
          _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
          pbVar4 = _c0_35 + 1;
          if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
            *(uint *)(_c0_25 + 0x21c) = uVar6;
            pbVar4 = _c0_35;
            _c0_28 = uVar8;
          }
          _c0_35 = pbVar4;
          uVar6 = (uint)_c0_35[1];
          uVar8 = _c0_28 << 8;
          _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
          pbVar4 = _c0_35 + 1;
          if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar6 != 0)) {
            *(uint *)(_c0_25 + 0x21c) = uVar6;
            pbVar4 = _c0_35;
            _c0_28 = uVar8;
          }
          _c0_35 = pbVar4;
          pbVar4 = _c0_35;
          _c0_35 = _c0_35 + 1;
          uVar6 = (uint)*_c0_35;
          uVar8 = _c0_28 << 8;
          _c0_28 = uVar8 | (long)(int)(uint)*pbVar4;
          c1_28 = c1_28 + 0x30;
          if ((*pbVar4 == 0xff) && (_c0_35 = pbVar4 + 2, uVar6 != 0)) {
            *(uint *)(_c0_25 + 0x21c) = uVar6;
            _c0_35 = pbVar4;
            _c0_28 = uVar8;
          }
        }
        uVar6 = *(uint *)(lVar3 + 0x128 +
                         (long)(int)((uint)(_c0_28 >> ((char)c1_28 - 8U & 0x3f)) & 0xff) * 4);
        local_a0 = (int)uVar6 >> 8;
        c1_28 = c1_28 - local_a0;
        local_94 = uVar6 & 0xff;
        if (8 < local_a0) {
          for (local_94 = (uint)(_c0_28 >> ((byte)c1_28 & 0x3f)) &
                          (1 << ((byte)(uVar6 >> 8) & 0x1f)) - 1U;
              *(long *)(lVar3 + (long)local_a0 * 8) < (long)(int)local_94;
              local_94 = (uint)(_c0_28 >> ((byte)c1_28 & 0x3f)) & 1 | local_94 << 1) {
            c1_28 = c1_28 + -1;
            local_a0 = local_a0 + 1;
          }
          if (local_a0 < 0x11) {
            local_94 = (uint)*(byte *)(*(long *)(lVar3 + 0x120) + 0x11 +
                                      (long)(int)(local_94 +
                                                  (int)*(undefined8 *)
                                                        (lVar3 + 0x90 + (long)local_a0 * 8) & 0xff))
            ;
          }
          else {
            local_94 = 0;
          }
        }
        uVar6 = local_94 & 0xf;
        if (uVar6 == 0) {
          if ((int)local_94 >> 4 != 0xf) break;
          local_98 = local_98 + 0xf;
        }
        else {
          local_98 = ((int)local_94 >> 4) + local_98;
          if (c1_28 < 0x11) {
            uVar7 = (uint)_c0_35[1];
            uVar8 = _c0_28 << 8;
            _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
            pbVar4 = _c0_35 + 1;
            if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar7 != 0)) {
              *(uint *)(_c0_25 + 0x21c) = uVar7;
              pbVar4 = _c0_35;
              _c0_28 = uVar8;
            }
            _c0_35 = pbVar4;
            uVar7 = (uint)_c0_35[1];
            uVar8 = _c0_28 << 8;
            _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
            pbVar4 = _c0_35 + 1;
            if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar7 != 0)) {
              *(uint *)(_c0_25 + 0x21c) = uVar7;
              pbVar4 = _c0_35;
              _c0_28 = uVar8;
            }
            _c0_35 = pbVar4;
            uVar7 = (uint)_c0_35[1];
            uVar8 = _c0_28 << 8;
            _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
            pbVar4 = _c0_35 + 1;
            if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar7 != 0)) {
              *(uint *)(_c0_25 + 0x21c) = uVar7;
              pbVar4 = _c0_35;
              _c0_28 = uVar8;
            }
            _c0_35 = pbVar4;
            uVar7 = (uint)_c0_35[1];
            uVar8 = _c0_28 << 8;
            _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
            pbVar4 = _c0_35 + 1;
            if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar7 != 0)) {
              *(uint *)(_c0_25 + 0x21c) = uVar7;
              pbVar4 = _c0_35;
              _c0_28 = uVar8;
            }
            _c0_35 = pbVar4;
            uVar7 = (uint)_c0_35[1];
            uVar8 = _c0_28 << 8;
            _c0_28 = uVar8 | (long)(int)(uint)*_c0_35;
            pbVar4 = _c0_35 + 1;
            if ((*_c0_35 == 0xff) && (pbVar4 = _c0_35 + 2, uVar7 != 0)) {
              *(uint *)(_c0_25 + 0x21c) = uVar7;
              pbVar4 = _c0_35;
              _c0_28 = uVar8;
            }
            _c0_35 = pbVar4;
            pbVar4 = _c0_35;
            _c0_35 = _c0_35 + 1;
            uVar7 = (uint)*_c0_35;
            uVar8 = _c0_28 << 8;
            _c0_28 = uVar8 | (long)(int)(uint)*pbVar4;
            c1_28 = c1_28 + 0x30;
            if ((*pbVar4 == 0xff) && (_c0_35 = pbVar4 + 2, uVar7 != 0)) {
              *(uint *)(_c0_25 + 0x21c) = uVar7;
              _c0_35 = pbVar4;
              _c0_28 = uVar8;
            }
          }
          c1_28 = c1_28 - uVar6;
          sVar10 = (sbyte)uVar6;
          uVar6 = (uint)(_c0_28 >> ((byte)c1_28 & 0x3f)) & (1 << sVar10) - 1U;
          local_1d0[jpeg_natural_order[local_98]] =
               (short)uVar6 +
               ((ushort)((int)(uVar6 - (1 << (sVar10 - 1U & 0x1f))) >> 0x1f) &
               (short)(-1 << sVar10) + 1U);
        }
      }
    }
    c1_35 = c1_35 + 1;
  } while( true );
}

Assistant:

LOCAL(boolean)
decode_mcu_fast(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  BITREAD_STATE_VARS;
  JOCTET *buffer;
  int blkn;
  savable_state state;
  /* Outer loop handles each block in the MCU */

  /* Load up working state */
  BITREAD_LOAD_STATE(cinfo, entropy->bitstate);
  buffer = (JOCTET *)br_state.next_input_byte;
  state = entropy->saved;

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    JBLOCKROW block = MCU_data ? MCU_data[blkn] : NULL;
    d_derived_tbl *dctbl = entropy->dc_cur_tbls[blkn];
    d_derived_tbl *actbl = entropy->ac_cur_tbls[blkn];
    register int s, k, r, l;

    HUFF_DECODE_FAST(s, l, dctbl);
    if (s) {
      FILL_BIT_BUFFER_FAST
      r = GET_BITS(s);
      s = HUFF_EXTEND(r, s);
    }

    if (entropy->dc_needed[blkn]) {
      int ci = cinfo->MCU_membership[blkn];
      /* Refer to the comment in decode_mcu_slow() regarding the supression of
       * a UBSan integer overflow error in this line of code.
       */
      s += state.last_dc_val[ci];
      state.last_dc_val[ci] = s;
      if (block)
        (*block)[0] = (JCOEF)s;
    }

    if (entropy->ac_needed[blkn] && block) {

      for (k = 1; k < DCTSIZE2; k++) {
        HUFF_DECODE_FAST(s, l, actbl);
        r = s >> 4;
        s &= 15;

        if (s) {
          k += r;
          FILL_BIT_BUFFER_FAST
          r = GET_BITS(s);
          s = HUFF_EXTEND(r, s);
          (*block)[jpeg_natural_order[k]] = (JCOEF)s;
        } else {
          if (r != 15) break;
          k += 15;
        }
      }

    } else {

      for (k = 1; k < DCTSIZE2; k++) {
        HUFF_DECODE_FAST(s, l, actbl);
        r = s >> 4;
        s &= 15;

        if (s) {
          k += r;
          FILL_BIT_BUFFER_FAST
          DROP_BITS(s);
        } else {
          if (r != 15) break;
          k += 15;
        }
      }
    }
  }

  if (cinfo->unread_marker != 0) {
    cinfo->unread_marker = 0;
    return FALSE;
  }

  br_state.bytes_in_buffer -= (buffer - br_state.next_input_byte);
  br_state.next_input_byte = buffer;
  BITREAD_SAVE_STATE(cinfo, entropy->bitstate);
  entropy->saved = state;
  return TRUE;
}